

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_fe241b::AverageTest<unsigned_short>::AverageTest
          (AverageTest<unsigned_short> *this)

{
  undefined8 *in_RDI;
  int unaff_retaddr;
  int in_stack_00000008;
  int in_stack_0000000c;
  
  testing::
  WithParamInterface<std::tuple<int,_int,_int,_int,_int,_unsigned_int_(*)(const_unsigned_char_*,_int)>_>
  ::GetParam();
  std::get<0ul,int,int,int,int,int,unsigned_int(*)(unsigned_char_const*,int)>
            ((tuple<int,_int,_int,_int,_int,_unsigned_int_(*)(const_unsigned_char_*,_int)> *)
             0xa41610);
  testing::
  WithParamInterface<std::tuple<int,_int,_int,_int,_int,_unsigned_int_(*)(const_unsigned_char_*,_int)>_>
  ::GetParam();
  std::get<1ul,int,int,int,int,int,unsigned_int(*)(unsigned_char_const*,int)>
            ((tuple<int,_int,_int,_int,_int,_unsigned_int_(*)(const_unsigned_char_*,_int)> *)
             0xa41622);
  testing::
  WithParamInterface<std::tuple<int,_int,_int,_int,_int,_unsigned_int_(*)(const_unsigned_char_*,_int)>_>
  ::GetParam();
  std::get<2ul,int,int,int,int,int,unsigned_int(*)(unsigned_char_const*,int)>
            ((tuple<int,_int,_int,_int,_int,_unsigned_int_(*)(const_unsigned_char_*,_int)> *)
             0xa41635);
  AverageTestBase<unsigned_short>::AverageTestBase
            (&this->super_AverageTestBase<unsigned_short>,in_stack_0000000c,in_stack_00000008,
             unaff_retaddr);
  testing::
  WithParamInterface<std::tuple<int,_int,_int,_int,_int,_unsigned_int_(*)(const_unsigned_char_*,_int)>_>
  ::WithParamInterface
            ((WithParamInterface<std::tuple<int,_int,_int,_int,_int,_unsigned_int_(*)(const_unsigned_char_*,_int)>_>
              *)(in_RDI + 6));
  *in_RDI = &PTR__AverageTest_01f95cc0;
  in_RDI[6] = &PTR__AverageTest_01f95d00;
  in_RDI[7] = 0;
  in_RDI[8] = 0;
  return;
}

Assistant:

AverageTest()
      : AverageTestBase<Pixel>(GET_PARAM(0), GET_PARAM(1), GET_PARAM(2)) {}